

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_InterpBndryData.cpp
# Opt level: O3

void __thiscall
amrex::InterpBndryData::setBndryValues
          (InterpBndryData *this,MultiFab *mf,int mf_start,int bnd_start,int num_comp,
          IntVect *ref_ratio,BCRec *bc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  pointer ppFVar13;
  Box *pBVar14;
  FArrayBox *pFVar15;
  FArrayBox *pFVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int *piVar21;
  int dir;
  int iVar22;
  long lVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  uint uVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  MFIter mfi;
  long local_178;
  long local_138;
  undefined1 local_ac [4];
  int local_a8;
  int local_a4 [5];
  MFIter local_90;
  
  uVar30 = (ulong)(uint)bnd_start;
  if (0 < num_comp) {
    do {
      (*(this->super_BndryData).super_BndryRegister._vptr_BndryRegister[3])
                (this,bc,ref_ratio,uVar30);
      uVar36 = (int)uVar30 + 1;
      uVar30 = (ulong)uVar36;
    } while ((int)uVar36 < num_comp + bnd_start);
  }
  local_ac[0] = false;
  local_ac[1] = true;
  local_ac[2] = true;
  local_a8 = Gpu::Device::max_gpu_streams;
  local_a4[0] = 0;
  local_a4[1] = 0;
  local_a4[2] = 0;
  MFIter::MFIter(&local_90,(FabArrayBase *)mf,(MFItInfo *)local_ac);
  if (local_90.currentIndex < local_90.endIndex) {
    do {
      BATransformer::operator()
                ((Box *)local_ac,&((local_90.fabArray)->boxarray).m_bat,
                 (Box *)((long)((local_90.index_map)->super_vector<int,_std::allocator<int>_>).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[local_90.currentIndex] * 0x1c +
                        *(long *)&((((local_90.fabArray)->boxarray).m_ref.
                                    super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->m_abox).
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data));
      ppFVar13 = (mf->super_FabArray<amrex::FArrayBox>).m_fabs_v.
                 super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
      uVar30 = 0;
      do {
        uVar36 = (int)uVar30 + (int)((uVar30 & 0xffffffff) / 3) * -3;
        uVar29 = (ulong)(uVar36 * 4);
        piVar21 = (int *)local_ac;
        if (2 < uVar30) {
          piVar21 = local_a4 + 1;
        }
        pBVar14 = (Box *)&(this->super_BndryData).geom.domain.bigend;
        if (2 >= uVar30) {
          pBVar14 = &(this->super_BndryData).geom.domain;
        }
        if ((*(int *)((long)piVar21 + uVar29) == *(int *)((long)(pBVar14->smallend).vect + uVar29))
           && (*(char *)((long)(this->super_BndryData).geom.super_CoordSys.inv_dx +
                        (ulong)uVar36 + 0x19) == '\0')) {
          lVar23 = (long)local_90.currentIndex;
          if (local_90.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
            lVar23 = (long)((local_90.local_index_map)->super_vector<int,_std::allocator<int>_>).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[local_90.currentIndex];
          }
          if (0 < num_comp) {
            pFVar15 = (this->super_BndryData).super_BndryRegister.bndry[uVar30].m_mf.
                      super_FabArray<amrex::FArrayBox>.m_fabs_v.
                      super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar23];
            pFVar16 = ppFVar13[lVar23];
            iVar1 = (pFVar15->super_BaseFab<double>).domain.smallend.vect[0];
            lVar26 = (long)iVar1;
            iVar2 = (pFVar15->super_BaseFab<double>).domain.smallend.vect[1];
            lVar25 = (long)iVar2;
            iVar3 = (pFVar15->super_BaseFab<double>).domain.smallend.vect[2];
            lVar23 = (long)iVar3;
            iVar4 = (pFVar15->super_BaseFab<double>).domain.bigend.vect[0];
            iVar5 = (pFVar15->super_BaseFab<double>).domain.bigend.vect[1];
            iVar6 = (pFVar15->super_BaseFab<double>).domain.bigend.vect[2];
            iVar7 = (pFVar16->super_BaseFab<double>).domain.smallend.vect[0];
            lVar32 = (long)iVar7;
            iVar8 = (pFVar16->super_BaseFab<double>).domain.smallend.vect[1];
            lVar27 = (long)iVar8;
            iVar9 = (pFVar16->super_BaseFab<double>).domain.bigend.vect[0];
            iVar10 = (pFVar16->super_BaseFab<double>).domain.bigend.vect[1];
            iVar11 = (pFVar16->super_BaseFab<double>).domain.smallend.vect[2];
            lVar37 = (long)iVar11;
            iVar12 = (pFVar16->super_BaseFab<double>).domain.bigend.vect[2];
            iVar17 = iVar6;
            if (iVar12 < iVar6) {
              iVar17 = iVar12;
            }
            iVar18 = iVar5;
            if (iVar10 < iVar5) {
              iVar18 = iVar10;
            }
            iVar19 = iVar4;
            if (iVar9 < iVar4) {
              iVar19 = iVar9;
            }
            iVar22 = iVar3;
            if (iVar3 < iVar11) {
              iVar22 = iVar11;
            }
            iVar20 = iVar2;
            if (iVar2 < iVar8) {
              iVar20 = iVar8;
            }
            iVar24 = iVar1;
            if (iVar1 < iVar7) {
              iVar24 = iVar7;
            }
            lVar34 = lVar32;
            if (lVar32 < lVar26) {
              lVar34 = lVar26;
            }
            lVar31 = lVar27;
            if (lVar27 < lVar25) {
              lVar31 = lVar25;
            }
            lVar35 = lVar37;
            if (lVar37 < lVar23) {
              lVar35 = lVar23;
            }
            lVar28 = (long)((iVar12 - iVar11) + 1);
            lVar40 = (long)((iVar10 - iVar8) + 1);
            lVar39 = (long)((iVar9 - iVar7) + 1);
            local_138 = (((long)mf_start * 8 * lVar28 + lVar35 * 8 + lVar37 * -8) * lVar40 +
                         lVar31 * 8 + lVar27 * -8) * lVar39 + lVar34 * 8 + lVar32 * -8 +
                        (long)(pFVar16->super_BaseFab<double>).dptr;
            lVar27 = (long)((iVar6 - iVar3) + 1);
            lVar37 = (long)((iVar5 - iVar2) + 1);
            lVar32 = (long)((iVar4 - iVar1) + 1);
            local_178 = (((long)bnd_start * 8 * lVar27 + lVar35 * 8 + lVar23 * -8) * lVar37 +
                         lVar31 * 8 + lVar25 * -8) * lVar32 + lVar34 * 8 + lVar26 * -8 +
                        (long)(pFVar15->super_BaseFab<double>).dptr;
            lVar25 = lVar40 * lVar39 * 8;
            lVar23 = lVar37 * lVar32 * 8;
            uVar29 = 0;
            do {
              lVar26 = lVar35;
              lVar37 = local_138;
              lVar34 = local_178;
              if (iVar22 <= iVar17) {
                do {
                  lVar40 = lVar31;
                  lVar33 = lVar34;
                  lVar38 = lVar37;
                  if (iVar20 <= iVar18) {
                    do {
                      if (iVar24 <= iVar19) {
                        lVar41 = 0;
                        do {
                          *(undefined8 *)(lVar33 + lVar41 * 8) =
                               *(undefined8 *)(lVar38 + lVar41 * 8);
                          lVar41 = lVar41 + 1;
                        } while ((iVar19 - iVar24) + 1 != (int)lVar41);
                      }
                      lVar40 = lVar40 + 1;
                      lVar38 = lVar38 + lVar39 * 8;
                      lVar33 = lVar33 + lVar32 * 8;
                    } while ((((int)lVar31 + iVar18) - iVar20) + 1 != (int)lVar40);
                  }
                  lVar26 = lVar26 + 1;
                  lVar37 = lVar37 + lVar25;
                  lVar34 = lVar34 + lVar23;
                } while (((iVar17 + (int)lVar35) - iVar22) + 1 != (int)lVar26);
              }
              uVar29 = uVar29 + 1;
              local_138 = local_138 + lVar28 * lVar25;
              local_178 = local_178 + lVar27 * lVar23;
            } while (uVar29 != (uint)num_comp);
          }
        }
        uVar30 = uVar30 + 1;
      } while (uVar30 != 6);
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
InterpBndryData::setBndryValues (const MultiFab& mf,
                                 int             mf_start,
                                 int             bnd_start,
                                 int             num_comp,
                                 const IntVect&  ref_ratio,
                                 const BCRec&    bc)
{
    //
    // Check that boxarrays are identical.
    //
    BL_ASSERT(grids.size());
    BL_ASSERT(grids == mf.boxArray());

    for (int n = bnd_start; n < bnd_start+num_comp; ++n) {
        setBndryConds(bc, ref_ratio, n);
    }

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(mf,MFItInfo().SetDynamic(true)); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.validbox();

        for (OrientationIter fi; fi; ++fi)
        {
            const Orientation face = fi();

            if (bx[face]==geom.Domain()[face] && !geom.isPeriodic(face.coordDir()))
            {
                //
                // Physical bndry, copy from grid.
                //
                auto& bnd_fab = bndry[face][mfi];
                auto const& src_fab = mf[mfi];
                auto bnd_array = bnd_fab.array();
                auto const src_array = src_fab.array();
                const Box& b = src_fab.box() & bnd_fab.box();
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( b, num_comp, i, j, k, n,
                {
                    bnd_array(i,j,k,n+bnd_start) = src_array(i,j,k,n+mf_start);
                });
            }
        }
    }
}